

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

AMQP_VALUE amqpvalue_create_modified(MODIFIED_HANDLE modified)

{
  MODIFIED_INSTANCE *modified_instance;
  AMQP_VALUE result;
  MODIFIED_HANDLE modified_local;
  
  if (modified == (MODIFIED_HANDLE)0x0) {
    modified_instance = (MODIFIED_INSTANCE *)0x0;
  }
  else {
    modified_instance = (MODIFIED_INSTANCE *)amqpvalue_clone(modified->composite_value);
  }
  return (AMQP_VALUE)modified_instance;
}

Assistant:

AMQP_VALUE amqpvalue_create_modified(MODIFIED_HANDLE modified)
{
    AMQP_VALUE result;

    if (modified == NULL)
    {
        result = NULL;
    }
    else
    {
        MODIFIED_INSTANCE* modified_instance = (MODIFIED_INSTANCE*)modified;
        result = amqpvalue_clone(modified_instance->composite_value);
    }

    return result;
}